

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O1

void gtk_thin_up_frame(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  uint uVar2;
  uint uVar3;
  
  FVar1 = fl_color_average(0xff,c,0.6);
  Fl::set_box_color(FVar1);
  uVar2 = (w + x) - 2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)(x + 1U),(ulong)(uint)y,(ulong)uVar2);
  uVar3 = (y + h) - 2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)(y + 1U),(ulong)uVar3);
  FVar1 = fl_color_average(0x38,c,0.4);
  Fl::set_box_color(FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)(x + 1U),(ulong)((y + h) - 1),(ulong)uVar2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)((w + x) - 1),(ulong)(y + 1U),(ulong)uVar3);
  return;
}

Assistant:

static void gtk_thin_up_frame(int x, int y, int w, int h, Fl_Color c) {
  gtk_color(fl_color_average(FL_WHITE, c, 0.6f));
  fl_xyline(x + 1, y, x + w - 2);
  fl_yxline(x, y + 1, y + h - 2);

  gtk_color(fl_color_average(FL_BLACK, c, 0.4f));
  fl_xyline(x + 1, y + h - 1, x + w - 2);
  fl_yxline(x + w - 1, y + 1, y + h - 2);
}